

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPFakeTransmitter::SetMaximumPacketSize(RTPFakeTransmitter *this,size_t s)

{
  int iVar1;
  
  iVar1 = -0x84;
  if (((this->init == true) && (iVar1 = -0x83, this->created == true)) &&
     (iVar1 = -0x86, s < 0x10000)) {
    this->maxpacksize = s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPFakeTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (s > RTPFAKETRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}